

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::FReadFunc::checkArguments
          (FReadFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  ulong uVar3;
  Type *pTVar4;
  Expression *arg;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,2,4);
  if (bVar2) {
    bVar2 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
    if (!bVar2) {
      bVar2 = Type::isUnpackedArray(((*args->_M_ptr)->type).ptr);
      if (!bVar2) {
        arg = *args->_M_ptr;
        goto LAB_0030f0f7;
      }
    }
    bVar2 = Type::isIntegral((args->_M_ptr[1]->type).ptr);
    if (!bVar2) {
      arg = args->_M_ptr[1];
LAB_0030f0f7:
      pTVar4 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,arg);
      return pTVar4;
    }
    uVar3 = (args->_M_extent)._M_extent_value;
    if (2 < uVar3) {
      if (args->_M_ptr[2]->kind != EmptyArgument) {
        bVar2 = Type::isIntegral((args->_M_ptr[2]->type).ptr);
        if (!bVar2) {
          arg = args->_M_ptr[2];
          goto LAB_0030f0f7;
        }
        uVar3 = (args->_M_extent)._M_extent_value;
      }
      if (3 < uVar3) {
        bVar2 = Type::isIntegral((args->_M_ptr[3]->type).ptr);
        if (!bVar2) {
          arg = args->_M_ptr[3];
          goto LAB_0030f0f7;
        }
      }
    }
    pTVar4 = pCVar1->integerType;
  }
  else {
    pTVar4 = pCVar1->errorType;
  }
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 4))
            return comp.getErrorType();

        // First argument is integral or an unpacked array.
        if (!args[0]->type->isIntegral() && !args[0]->type->isUnpackedArray())
            return badArg(context, *args[0]);

        // Second argument is an fd (integral).
        if (!args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        if (args.size() > 2) {
            // Third arg can be empty or integral.
            if (args[2]->kind != ExpressionKind::EmptyArgument && !args[2]->type->isIntegral())
                return badArg(context, *args[2]);

            if (args.size() > 3) {
                // Fourth arg must be integral.
                if (!args[3]->type->isIntegral())
                    return badArg(context, *args[3]);
            }
        }

        return comp.getIntegerType();
    }